

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::MethodDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MethodDescriptor *this)

{
  MethodDescriptor *this_local;
  string *contents;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  DebugString(this,0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string MethodDescriptor::DebugString() const {
  string contents;
  DebugString(0, &contents);
  return contents;
}